

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O1

oonf_layer2_neigh * dlep_extension_get_l2_neighbor(dlep_session *session)

{
  char *key_00;
  int iVar1;
  avl_tree *tree;
  avl_node *paVar2;
  oonf_layer2_neigh_key key;
  oonf_layer2_neigh_key local_2b;
  
  iVar1 = dlep_extension_get_l2_neighbor_key(&local_2b,session);
  if (iVar1 == 0) {
    key_00 = (session->l2_listener).name;
    tree = oonf_layer2_get_net_tree();
    paVar2 = avl_find(tree,key_00);
    if (paVar2 != (avl_node *)0x0) {
      paVar2 = avl_find((avl_tree *)&paVar2[-0x21].key,&local_2b);
      if (paVar2 != (avl_node *)0x0) {
        return (oonf_layer2_neigh *)&paVar2[-0x16].parent;
      }
      return (oonf_layer2_neigh *)0x0;
    }
  }
  return (oonf_layer2_neigh *)0x0;
}

Assistant:

struct oonf_layer2_neigh *
dlep_extension_get_l2_neighbor(struct dlep_session *session) {
  struct oonf_layer2_net *l2net;

  struct oonf_layer2_neigh_key key;

  if (dlep_extension_get_l2_neighbor_key(&key, session)) {
    return NULL;
  }

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    return NULL;
  }
  return oonf_layer2_neigh_get_lid(l2net, &key);
}